

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.cpp
# Opt level: O2

bool __thiscall SNMPTrap::build(SNMPTrap *this)

{
  element_type *peVar1;
  ComplexType *pCVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  shared_ptr<ComplexType> ourVBList;
  undefined1 local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  shared_ptr<ComplexType> trapPDU;
  undefined1 local_d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  pCVar2 = (this->super_SNMPPacket).packet;
  if (pCVar2 != (ComplexType *)0x0) {
    (*(pCVar2->super_BER_CONTAINER)._vptr_BER_CONTAINER[1])();
  }
  if (this->trapOID == (OIDType *)0x0) {
    bVar3 = false;
  }
  else {
    pCVar2 = (ComplexType *)operator_new(0x28);
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(pCVar2->super_BER_CONTAINER)._type)->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x30;
    (pCVar2->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__ComplexType_0019b088;
    (pCVar2->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pCVar2->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pCVar2->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->super_SNMPPacket).packet = pCVar2;
    local_f8._0_4_ = (this->super_SNMPPacket).snmpVersion;
    std::make_shared<IntegerType,int>((int *)&ourVBList);
    trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList((ComplexType *)(local_40 + 1),(shared_ptr<BER_CONTAINER> *)pCVar2);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pCVar2 = (this->super_SNMPPacket).packet;
    local_f8 = (undefined1  [8])(this->super_SNMPPacket).communityString._M_dataplus._M_p;
    std::make_shared<OctetType,char_const*>((char **)&ourVBList);
    trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList
              ((ComplexType *)(local_58 + 0x10),(shared_ptr<BER_CONTAINER> *)pCVar2);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_40);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
                  ,0xa4);
    std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)&trapPDU);
    peVar1 = trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    OIDType::cloneOID((OIDType *)local_f8);
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_f8;
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_f0._M_pi;
    local_f8 = (undefined1  [8])0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList((ComplexType *)local_58,(shared_ptr<BER_CONTAINER> *)peVar1);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
    peVar1 = trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::make_shared<NetworkAddress,IPAddress&>((IPAddress *)local_f8);
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_f8;
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_f0._M_pi;
    local_f8 = (undefined1  [8])0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList((ComplexType *)local_68,(shared_ptr<BER_CONTAINER> *)peVar1);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
    peVar1 = trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::make_shared<IntegerType,short&>((short *)local_f8);
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_f8;
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_f0._M_pi;
    local_f8 = (undefined1  [8])0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList((ComplexType *)local_78,(shared_ptr<BER_CONTAINER> *)peVar1);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
    peVar1 = trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::make_shared<IntegerType,short&>((short *)local_f8);
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_f8;
    ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_f0._M_pi;
    local_f8 = (undefined1  [8])0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList((ComplexType *)local_88,(shared_ptr<BER_CONTAINER> *)peVar1);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
    peVar1 = trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this->uptimeCallback == (TimestampCallback *)0x0) {
      local_d8._0_4_ = 0;
      std::make_shared<TimestampType,int>((int *)local_f8);
      this_00 = &_Stack_f0;
      ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_f8;
      ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_f0._M_pi;
      local_f8 = (undefined1  [8])0x0;
      _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ComplexType::addValueToList((ComplexType *)local_a8,(shared_ptr<BER_CONTAINER> *)peVar1);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    else {
      ValueCallback::getValueForCallback
                ((ValueCallback *)local_d8,&this->uptimeCallback->super_ValueCallback);
      std::static_pointer_cast<TimestampType,BER_CONTAINER>((shared_ptr<BER_CONTAINER> *)local_f8);
      ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_f8;
      ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_f0._M_pi;
      local_f8 = (undefined1  [8])0x0;
      _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ComplexType::addValueToList((ComplexType *)local_98,(shared_ptr<BER_CONTAINER> *)peVar1);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
      this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8);
    }
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    (*(this->super_SNMPPacket)._vptr_SNMPPacket[3])(&ourVBList,this);
    peVar1 = trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar3 = ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0;
    if (bVar3) {
      std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ComplexType,void>
                ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)local_f8,
                 &ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>);
      ComplexType::addValueToList((ComplexType *)local_b8,(shared_ptr<BER_CONTAINER> *)peVar1);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
      pCVar2 = (this->super_SNMPPacket).packet;
      std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ComplexType,void>
                ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)local_f8,
                 &trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>);
      ComplexType::addValueToList
                ((ComplexType *)(local_d8 + 0x10),(shared_ptr<BER_CONTAINER> *)pCVar2);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
    }
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &ourVBList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &trapPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return bVar3;
}

Assistant:

bool SNMPTrap::build(){
    // Building V1 Traps
    delete packet;

    if(!this->trapOID) return false;

    packet = new ComplexType(STRUCTURE);

    packet->addValueToList(std::make_shared<IntegerType>((int)this->snmpVersion));
    packet->addValueToList(std::make_shared<OctetType>(this->communityString.c_str()));
    auto trapPDU = std::make_shared<ComplexType>(TrapPDU);
    
    trapPDU->addValueToList(trapOID->cloneOID());
    trapPDU->addValueToList(std::make_shared<NetworkAddress>(agentIP));
    trapPDU->addValueToList(std::make_shared<IntegerType>(genericTrap));
    trapPDU->addValueToList(std::make_shared<IntegerType>(specificTrap));
    
    if(uptimeCallback){
        trapPDU->addValueToList(std::static_pointer_cast<TimestampType>(ValueCallback::getValueForCallback(uptimeCallback)));
    } else {
        trapPDU->addValueToList(std::make_shared<TimestampType>(0));
    }

    auto ourVBList = this->generateVarBindList();
    if(!ourVBList) return false;
    
    trapPDU->addValueToList(ourVBList);
    packet->addValueToList(trapPDU);
    return true;
}